

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::ReleaseMessage
          (ExtensionSet *this,int number,MessageLite *prototype)

{
  Arena *pAVar1;
  Extension *pEVar2;
  MessageLite *this_00;
  Arena *arena;
  ExtensionSet *const_this;
  
  pEVar2 = FindOrNull(this,number);
  if (pEVar2 == (Extension *)0x0) {
    return (MessageLite *)0x0;
  }
  if (pEVar2->is_repeated == false) {
    if (0xed < (byte)(pEVar2->type - 0x13)) {
      if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar2->type * 4) == 10) {
        pAVar1 = this->arena_;
        if ((pEVar2->field_0xa & 4) == 0) {
          this_00 = (MessageLite *)(pEVar2->field_0).int64_t_value;
          if (pAVar1 != (Arena *)0x0) {
            this_00 = MessageLite::New(this_00,(Arena *)0x0);
            MessageLite::CheckTypeAndMergeFrom(this_00,(MessageLite *)pEVar2->field_0);
          }
        }
        else {
          this_00 = (MessageLite *)
                    (**(code **)(**(long **)&(pEVar2->field_0).int32_t_value + 0x40))
                              (*(long **)&(pEVar2->field_0).int32_t_value,prototype,pAVar1);
          if ((pAVar1 == (Arena *)0x0) && ((long *)(pEVar2->field_0).int64_t_value != (long *)0x0))
          {
            (**(code **)(*(long *)(pEVar2->field_0).int64_t_value + 8))();
          }
        }
        Erase(this,number);
        return this_00;
      }
      goto LAB_0023c1b5;
    }
  }
  else {
    ReleaseMessage((ExtensionSet *)&stack0xffffffffffffffc8);
  }
  ReleaseMessage((ExtensionSet *)&stack0xffffffffffffffc8);
LAB_0023c1b5:
  ReleaseMessage();
}

Assistant:

MessageLite* ExtensionSet::ReleaseMessage(int number,
                                          const MessageLite& prototype) {
  Extension* extension = FindOrNull(number);
  if (extension == nullptr) {
    // Not present.  Return nullptr.
    return nullptr;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    MessageLite* ret = nullptr;
    if (extension->is_lazy) {
      Arena* const arena = arena_;
      ret = extension->ptr.lazymessage_value->ReleaseMessage(prototype, arena);
      if (arena == nullptr) {
        delete extension->ptr.lazymessage_value;
      }
    } else {
      if (arena_ == nullptr) {
        ret = extension->ptr.message_value;
      } else {
        // ReleaseMessage() always returns a heap-allocated message, and we are
        // on an arena, so we need to make a copy of this message to return.
        ret = extension->ptr.message_value->New();
        ret->CheckTypeAndMergeFrom(*extension->ptr.message_value);
      }
    }
    Erase(number);
    return ret;
  }
}